

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall SquareMatrix_Basics3_Test::TestBody(SquareMatrix_Basics3_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int i_1;
  Float (*paFVar4) [3];
  undefined1 (*pauVar5) [16];
  int i;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  AssertHelper *pAVar9;
  int i_4;
  int iVar10;
  internal *piVar11;
  Float (*this_00) [3];
  char *pcVar12;
  char *in_R9;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  AssertionResult gtest_ar_;
  optional<pbrt::SquareMatrix<3>_> inv;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  array<float,_3> v;
  SquareMatrix<3> m3;
  undefined1 local_170 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_160;
  Float FStack_150;
  char cStack_14c;
  undefined1 auStack_148 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  Float FStack_128;
  char cStack_124;
  AssertHelper AStack_120;
  undefined1 auStack_118 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_110;
  undefined1 *puStack_108;
  Float aFStack_100 [4];
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_d8;
  Float aFStack_d0 [6];
  AssertHelper local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  AssertHelper local_90;
  SquareMatrix<3> local_88;
  undefined8 local_60;
  Float local_58 [2];
  undefined8 local_50;
  Float local_48 [2];
  uint local_40 [3];
  SquareMatrix<3> local_34;
  
  paFVar4 = (Float (*) [3])&local_34;
  lVar6 = 0;
  do {
    auVar16 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar16,_DAT_005d1800);
    uVar2 = vpcmpeqq_avx512f(auVar16,_DAT_005d1840);
    auVar16 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar16 = vpsrld_avx512f(auVar16,0x1f);
    auVar16 = vcvtdq2ps_avx512f(auVar16);
    auVar16._12_4_ = paFVar4[1][0];
    auVar16._16_4_ = paFVar4[1][1];
    auVar16._20_4_ = paFVar4[1][2];
    auVar16._24_4_ = paFVar4[2][0];
    auVar16._28_4_ = paFVar4[2][1];
    auVar16._32_4_ = paFVar4[2][2];
    auVar16._36_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][0];
    auVar16._40_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][1];
    auVar16._44_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][2];
    auVar16._48_4_ = paFVar4[4][0];
    auVar16._52_4_ = paFVar4[4][1];
    auVar16._56_4_ = paFVar4[4][2];
    auVar16._60_4_ = paFVar4[5][0];
    *(undefined1 (*) [64])paFVar4 = auVar16;
    lVar6 = lVar6 + 1;
    paFVar4 = paFVar4 + 1;
  } while (lVar6 != 3);
  bVar3 = pbrt::SquareMatrix<3>::IsIdentity(&local_34);
  local_170[0] = (internal)bVar3;
  sStack_168.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_148,(internal *)local_170,(AssertionResult *)"m3.IsIdentity()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x191,(char *)auStack_148);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (auStack_148 != (undefined1  [8])&aStack_138) {
      operator_delete((void *)auStack_148,aStack_138._M_allocated_capacity + 1);
    }
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b8.data_ + 8))();
      }
      local_b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auStack_148 = (undefined1  [8])0x3f800000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0x3f800000;
  aStack_138._8_8_ = 0;
  FStack_128 = 1.0;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_170,"m3","SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1)",&local_34,
             (SquareMatrix<3> *)auStack_148);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if (sStack_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x193,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)auStack_148 + 8))();
      }
      auStack_148 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auStack_148 = (undefined1  [8])0x3f80000000000000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0x3f800000;
  aStack_138._8_8_ = 0;
  FStack_128 = 1.0;
  piVar11 = (internal *)local_170;
  testing::internal::CmpHelperNE<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            (piVar11,"m3","SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1)",&local_34,
             (SquareMatrix<3> *)auStack_148);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if (sStack_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x194,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)auStack_148 + 8))();
      }
      auStack_148 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auStack_148 = (undefined1  [8])&DAT_40000000;
  sStack_140.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  aStack_138._M_allocated_capacity = 0xbf800000;
  aStack_138._8_8_ = 0;
  FStack_128 = 3.0;
  lVar6 = 0;
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  do {
    auVar18 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar18,auVar16);
    uVar2 = vpcmpeqq_avx512f(auVar18,auVar17);
    auVar18 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar18 = vpsrld_avx512f(auVar18,0x1f);
    auVar18 = vcvtdq2ps_avx512f(auVar18);
    auVar18._12_4_ = *(undefined4 *)(piVar11 + 0xc);
    auVar18._16_4_ = *(undefined4 *)(piVar11 + 0x10);
    auVar18._20_4_ = *(undefined4 *)(piVar11 + 0x14);
    auVar18._24_4_ = *(undefined4 *)(piVar11 + 0x18);
    auVar18._28_4_ = *(undefined4 *)(piVar11 + 0x1c);
    auVar18._32_4_ = *(undefined4 *)(piVar11 + 0x20);
    auVar18._36_4_ = *(undefined4 *)(piVar11 + 0x24);
    auVar18._40_4_ = *(undefined4 *)(piVar11 + 0x28);
    auVar18._44_4_ = *(undefined4 *)(piVar11 + 0x2c);
    auVar18._48_4_ = *(undefined4 *)(piVar11 + 0x30);
    auVar18._52_4_ = *(undefined4 *)(piVar11 + 0x34);
    auVar18._56_4_ = *(undefined4 *)(piVar11 + 0x38);
    auVar18._60_4_ = *(undefined4 *)(piVar11 + 0x3c);
    *(undefined1 (*) [64])piVar11 = auVar18;
    lVar6 = lVar6 + 1;
    piVar11 = piVar11 + 0xc;
  } while (lVar6 != 3);
  local_170._0_4_ = 2.0;
  aStack_160._M_allocated_capacity._0_4_ = 0xbf800000;
  FStack_150 = 3.0;
  paFVar4 = (Float (*) [3])auStack_148;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&local_b8,"SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3)",
             "SquareMatrix<3>::Diag(2, -1, 3)",(SquareMatrix<3> *)paFVar4,
             (SquareMatrix<3> *)local_170);
  if (local_b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if (sStack_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x197,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_170,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)auStack_148 + 8))();
      }
      auStack_148 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_00 = (Float (*) [3])&local_b8;
  local_b8.data_ = (AssertHelperData *)0x400000003f800000;
  sStack_b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4080000040400000;
  uStack_a8 = 0x40c0000040a00000;
  uStack_a0 = 0x4100000040e00000;
  local_98 = 0x41100000;
  bVar3 = pbrt::SquareMatrix<3>::IsIdentity((SquareMatrix<3> *)this_00);
  local_170[0] = (internal)!bVar3;
  sStack_168.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_148,(internal *)local_170,(AssertionResult *)"m.IsIdentity()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19a,(char *)auStack_148);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (auStack_148 != (undefined1  [8])&aStack_138) {
      operator_delete((void *)auStack_148,aStack_138._M_allocated_capacity + 1);
    }
    if ((long *)local_88.m[0]._0_8_ != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_88.m[0]._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88.m[0]._0_8_ + 8))();
      }
      local_88.m[0]._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.m[0][0] = 1.0;
  local_88.m[0][1] = 4.0;
  local_88.m[0][2] = 7.0;
  local_88.m[1][0] = 2.0;
  local_88.m[1][1] = 5.0;
  local_88.m[1][2] = 8.0;
  local_88.m[2][0] = 3.0;
  local_88.m[2][1] = 6.0;
  local_88.m[2][2] = 9.0;
  lVar6 = 0;
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  do {
    auVar18 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar18,auVar16);
    uVar2 = vpcmpeqq_avx512f(auVar18,auVar17);
    auVar18 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar18 = vpsrld_avx512f(auVar18,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar18);
    auVar18 = *(undefined1 (*) [64])paFVar4;
    auVar19._12_4_ = auVar18._12_4_;
    auVar19._16_4_ = auVar18._16_4_;
    auVar19._20_4_ = auVar18._20_4_;
    auVar19._24_4_ = auVar18._24_4_;
    auVar19._28_4_ = auVar18._28_4_;
    auVar19._32_4_ = auVar18._32_4_;
    auVar19._36_4_ = auVar18._36_4_;
    auVar19._40_4_ = auVar18._40_4_;
    auVar19._44_4_ = auVar18._44_4_;
    auVar19._48_4_ = auVar18._48_4_;
    auVar19._52_4_ = auVar18._52_4_;
    auVar19._56_4_ = auVar18._56_4_;
    auVar19._60_4_ = auVar18._60_4_;
    *(undefined1 (*) [64])paFVar4 = auVar19;
    lVar6 = lVar6 + 1;
    paFVar4 = paFVar4 + 1;
  } while (lVar6 != 3);
  auVar14 = vpbroadcastq_avx512vl();
  auVar14 = vpaddq_avx2(auVar14,_DAT_005d1560);
  pauVar5 = (undefined1 (*) [16])auStack_148;
  puVar7 = (undefined8 *)0x0;
  do {
    auVar15 = vpbroadcastq_avx512vl();
    auVar15 = vpsllq_avx2(auVar15,2);
    vpaddq_avx2(auVar14,auVar15);
    auVar13 = vgatherqps_avx512vl(*puVar7);
    auVar13._12_4_ = SUB164(*pauVar5,0xc);
    *pauVar5 = auVar13;
    puVar7 = (undefined8 *)((long)puVar7 + 1);
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + 0xc);
  } while (puVar7 != (undefined8 *)0x3);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)local_170,"Transpose(m)","mt",(SquareMatrix<3> *)auStack_148,&local_88);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)auStack_148);
    if (sStack_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)auStack_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (auStack_148 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (auStack_148 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)auStack_148 + 8))();
      }
      auStack_148 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40[0] = 0x3f800000;
  local_40[1] = 0xc0000000;
  local_40[2] = 0x40800000;
  sStack_140.ptr_ = sStack_140.ptr_ & 0xffffffff00000000;
  auStack_148 = (undefined1  [8])0x0;
  lVar6 = 0;
  do {
    *(undefined4 *)(auStack_148 + lVar6 * 4) = 0;
    auVar13 = ZEXT816(0) << 0x40;
    lVar8 = 0;
    do {
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)(*(Float (*) [3])*this_00)[lVar8]),
                                ZEXT416(local_40[lVar8]));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    *(int *)(auStack_148 + lVar6 * 4) = auVar13._0_4_;
    lVar6 = lVar6 + 1;
    this_00 = this_00 + 1;
  } while (lVar6 != 3);
  local_50 = (pointer)auStack_148;
  local_48[0] = sStack_140.ptr_._0_4_;
  local_170._0_4_ = 9;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"1 - 4 + 12","vt[0]",(int *)local_170,(float *)&local_50);
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a0,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"4 - 10 + 24","vt[1]",(int *)local_170,
             (float *)((long)&local_50 + 4));
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a1,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"7 - 16 + 36","vt[2]",(int *)local_170,local_48);
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a2,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auStack_148 = (undefined1  [8])0x0;
  local_170 = (undefined1  [8])((ulong)local_170 & 0xffffffff00000000);
  pAVar9 = &local_b8;
  lVar6 = 0;
  do {
    iVar10 = (int)lVar6;
    piVar11 = (internal *)auStack_148;
    if ((iVar10 != 0) && (piVar11 = (internal *)(auStack_148 + 4), iVar10 != 1)) {
      piVar11 = (internal *)local_170;
    }
    *(int *)piVar11 = 0;
    lVar8 = 0;
    do {
      piVar11 = (internal *)auStack_148;
      if ((iVar10 != 0) && (piVar11 = (internal *)(auStack_148 + 4), iVar10 != 1)) {
        piVar11 = (internal *)local_170;
      }
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)(lVar8 == 0) * 0x3f800000 +
                                        (uint)(lVar8 != 0) *
                                        *(int *)(&DAT_005d1488 + (ulong)(lVar8 == 1) * 4)),
                                ZEXT416(*(uint *)((long)&pAVar9->data_ + lVar8 * 4)),
                                ZEXT416(*(uint *)piVar11));
      *(int *)piVar11 = auVar13._0_4_;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    pAVar9 = (AssertHelper *)((long)&pAVar9[1].data_ + 4);
  } while (lVar6 != 3);
  local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)auStack_148;
  local_58[0] = (Float)local_170._0_4_;
  local_170._0_4_ = 9;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"1 - 4 + 12","v3t[0]",(int *)local_170,(float *)&local_60);
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a6,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"4 - 10 + 24","v3t[1]",(int *)local_170,
             (float *)((long)&local_60 + 4));
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a7,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)auStack_148,"7 - 16 + 36","v3t[2]",(int *)local_170,local_58);
  if (auStack_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if (sStack_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((sStack_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a8,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)auStack_118,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_118);
    if (local_170 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_170 + 8))();
      }
      local_170 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pbrt::Inverse<3>(&local_34);
  auStack_118[0] = cStack_124;
  sStack_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cStack_124 == '\0') {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)auStack_118,(AssertionResult *)"inv.has_value()",
               "false","true",(char *)piVar11);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1ab,(char *)local_170);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_170 != (undefined1  [8])&aStack_160) {
      operator_delete((void *)local_170,aStack_160._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_e0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_e0 + 8))();
      }
      local_e0 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (cStack_124 != '\0') {
    testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
              ((internal *)local_170,"m3","*inv",&local_34,(SquareMatrix<3> *)auStack_148);
    if (local_170[0] == (internal)0x0) {
      testing::Message::Message((Message *)auStack_118);
      if (sStack_168.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = ((sStack_168.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x1ac,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)auStack_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
      if (auStack_118 != (undefined1  [8])0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (auStack_118 != (undefined1  [8])0x0)) {
          (**(code **)(*(long *)auStack_118 + 8))();
        }
        auStack_118 = (undefined1  [8])0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auStack_118 = (undefined1  [8])&DAT_40000000;
    sStack_110.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    puStack_108 = &DAT_40800000;
    aFStack_100[0] = 0.0;
    aFStack_100[1] = 0.0;
    aFStack_100[2] = -1.0;
    pbrt::Inverse<3>((SquareMatrix<3> *)auStack_118);
    if (cStack_124 == '\x01') {
      cStack_124 = '\0';
    }
    if (cStack_14c == '\x01') {
      FStack_128 = FStack_150;
      auStack_148 = local_170;
      sStack_140.ptr_ = sStack_168.ptr_;
      aStack_138._M_allocated_capacity = aStack_160._M_allocated_capacity;
      aStack_138._8_8_ = aStack_160._8_8_;
      cStack_124 = '\x01';
      cStack_14c = '\0';
    }
    if (cStack_14c == '\x01') {
      cStack_14c = '\0';
    }
    local_e0[0] = (internal)cStack_124;
    sStack_d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (cStack_124 == '\0') {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,(internal *)local_e0,(AssertionResult *)"inv.has_value()",
                 "false","true",(char *)piVar11);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                 ,0x1b0,(char *)local_170);
      testing::internal::AssertHelper::operator=(&AStack_120,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_120);
      if (local_170 != (undefined1  [8])&aStack_160) {
        operator_delete((void *)local_170,aStack_160._M_allocated_capacity + 1);
      }
      if (local_f0.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_f0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_f0.data_ + 8))();
        }
        local_f0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_170 = (undefined1  [8])&DAT_3f000000;
    sStack_168.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    aStack_160._M_allocated_capacity = 0x3e800000;
    aStack_160._8_4_ = 0.0;
    aStack_160._12_4_ = 0.0;
    FStack_150 = -1.0;
    if (cStack_124 != '\0') {
      testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
                ((internal *)local_e0,"SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1)","*inv",
                 (SquareMatrix<3> *)local_170,(SquareMatrix<3> *)auStack_148);
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_170);
        if (sStack_d8.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = ((sStack_d8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                   ,0x1b1,pcVar12);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_170 != (undefined1  [8])0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (local_170 != (undefined1  [8])0x0)) {
            (**(code **)(*(size_type *)local_170 + 8))();
          }
          local_170 = (undefined1  [8])0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_e0 = (undefined1  [8])0x0;
      sStack_d8.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_40000000;
      aFStack_d0[0] = 0.0;
      aFStack_d0[1] = 0.0;
      aFStack_d0[2] = 1.0;
      aFStack_d0[3] = 1.0;
      aFStack_d0[4] = 1.0;
      pbrt::Inverse<3>((SquareMatrix<3> *)local_e0);
      if (cStack_124 == '\x01') {
        cStack_124 = '\0';
      }
      if (cStack_14c == '\x01') {
        FStack_128 = FStack_150;
        auStack_148 = local_170;
        sStack_140.ptr_ = sStack_168.ptr_;
        aStack_138._M_allocated_capacity = aStack_160._M_allocated_capacity;
        aStack_138._8_8_ = aStack_160._8_8_;
        cStack_124 = '\x01';
        cStack_14c = '\0';
      }
      if (cStack_14c == '\x01') {
        cStack_14c = '\0';
      }
      local_f0.data_ = (AssertHelperData *)(CONCAT71(local_f0.data_._1_7_,cStack_124) ^ 1);
      local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (cStack_124 != '\0') {
        testing::Message::Message((Message *)&AStack_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,(internal *)&local_f0,(AssertionResult *)"inv.has_value()",
                   "true","false",(char *)piVar11);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
                   ,0x1b5,(char *)local_170);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&AStack_120);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_170 != (undefined1  [8])&aStack_160) {
          operator_delete((void *)local_170,aStack_160._M_allocated_capacity + 1);
        }
        if (AStack_120.data_ != (AssertHelperData *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (AStack_120.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)AStack_120.data_ + 8))();
          }
          AStack_120.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    pbrt::LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
  }
  pbrt::LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
}

Assistant:

TEST(SquareMatrix, Basics3) {
    SquareMatrix<3> m3;
    EXPECT_TRUE(m3.IsIdentity());

    EXPECT_EQ(m3, SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1));
    EXPECT_NE(m3, SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1));

    EXPECT_EQ(SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3),
              SquareMatrix<3>::Diag(2, -1, 3));

    SquareMatrix<3> m(1, 2, 3, 4, 5, 6, 7, 8, 9);
    EXPECT_FALSE(m.IsIdentity());
    SquareMatrix<3> mt(1, 4, 7, 2, 5, 8, 3, 6, 9);
    EXPECT_EQ(Transpose(m), mt);

    pstd::array<Float, 3> v{1, -2, 4};
    pstd::array<Float, 3> vt = m * v;
    EXPECT_EQ(1 - 4 + 12, vt[0]);
    EXPECT_EQ(4 - 10 + 24, vt[1]);
    EXPECT_EQ(7 - 16 + 36, vt[2]);

    Vector3f v3(1, -2, 4);
    Vector3f v3t = m * v3;
    EXPECT_EQ(1 - 4 + 12, v3t[0]);
    EXPECT_EQ(4 - 10 + 24, v3t[1]);
    EXPECT_EQ(7 - 16 + 36, v3t[2]);

    pstd::optional<SquareMatrix<3>> inv = Inverse(m3);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(m3, *inv);

    SquareMatrix<3> ms(2, 0, 0, 0, 4, 0, 0, 0, -1);
    inv = Inverse(ms);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1), *inv);

    SquareMatrix<3> degen(0, 0, 2, 0, 0, 0, 1, 1, 1);
    inv = Inverse(degen);
    EXPECT_FALSE(inv.has_value());
}